

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_is_valid_datatype(int dtype)

{
  if (0x1ff < dtype) {
    if (dtype < 0x600) {
      if (dtype < 0x400) {
        if ((dtype != 0x200) && (dtype != 0x300)) {
          return 0;
        }
      }
      else if ((dtype != 0x400) && (dtype != 0x500)) {
        return 0;
      }
    }
    else if (dtype < 0x800) {
      if ((dtype != 0x600) && (dtype != 0x700)) {
        return 0;
      }
    }
    else if ((dtype != 0x800) && (dtype != 0x900)) {
      return 0;
    }
    return 1;
  }
  if ((dtype - 2U < 0x3f) && ((0x4000000040004045U >> ((ulong)(dtype - 2U) & 0x3f) & 1) != 0)) {
    return 1;
  }
  if (dtype == 0x80) {
    return 1;
  }
  if (dtype == 0x100) {
    return 1;
  }
  return 0;
}

Assistant:

int nifti_is_valid_datatype( int dtype )
{
   if( dtype == NIFTI_TYPE_UINT8        ||
       dtype == NIFTI_TYPE_INT16        ||
       dtype == NIFTI_TYPE_INT32        ||
       dtype == NIFTI_TYPE_FLOAT32      ||
       dtype == NIFTI_TYPE_COMPLEX64    ||
       dtype == NIFTI_TYPE_FLOAT64      ||
       dtype == NIFTI_TYPE_RGB24        ||
       dtype == NIFTI_TYPE_RGBA32       ||
       dtype == NIFTI_TYPE_INT8         ||
       dtype == NIFTI_TYPE_UINT16       ||
       dtype == NIFTI_TYPE_UINT32       ||
       dtype == NIFTI_TYPE_INT64        ||
       dtype == NIFTI_TYPE_UINT64       ||
       dtype == NIFTI_TYPE_FLOAT128     ||
       dtype == NIFTI_TYPE_COMPLEX128   ||
       dtype == NIFTI_TYPE_COMPLEX256 ) return 1;
   return 0;
}